

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall imrt::Collimator::insertYorder(Collimator *this,double y)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *this_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var1;
  reference pvVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double in_XMM0_Qa;
  value_type_conflict1 *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  const_iterator in_stack_00000018;
  int j;
  bool flag;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *this_01;
  double *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar3;
  int local_3c;
  bool local_11;
  
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
  __last._M_current._7_1_ = in_stack_ffffffffffffff97;
  __last._M_current._0_7_ = in_stack_ffffffffffffff90;
  std::find<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (in_RDI,__last,in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
  local_11 = __gnu_cxx::operator!=
                       (in_stack_ffffffffffffff80,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                         *)in_stack_ffffffffffffff78);
  local_3c = 0;
  while( true ) {
    this_00 = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
              (long)local_3c;
    p_Var1 = (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
             std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 0xf));
    bVar3 = 0;
    if (this_00 < p_Var1) {
      bVar3 = local_11 ^ 0xff;
    }
    if ((bVar3 & 1) == 0) break;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 0xf),
                        (long)local_3c);
    if (in_XMM0_Qa < *pvVar2) {
      this_01 = (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                (in_RDI._M_current + 0xf);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+(this_00,(difference_type)this_01);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                (this_01,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffff78);
      std::vector<double,_std::allocator<double>_>::insert
                (in_stack_00000010,in_stack_00000018,in_stack_00000008);
      local_11 = true;
    }
    local_3c = local_3c + 1;
  }
  if (local_11 == false) {
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)CONCAT17(bVar3,in_stack_ffffffffffffff90),
               (value_type_conflict1 *)this_00);
  }
  return;
}

Assistant:

void Collimator::insertYorder(double y) {
    bool flag=false;
    if (find(ycoord.begin(), ycoord.end(), y) != ycoord.end())
      flag=true;
    for (int j=0; j< ycoord.size() && !flag; j++) {
      if (ycoord[j] > y) {
        ycoord.insert(ycoord.begin()+j, y);
        flag=true;
      }
    }
    if (!flag) ycoord.push_back(y);
  }